

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tattoo.c
# Opt level: O0

void do_invoke_gabe(CHAR_DATA *ch)

{
  OBJ_DATA *arg1;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  OBJ_DATA *obj;
  void *in_stack_ffffffffffffffe8;
  void *in_stack_fffffffffffffff0;
  
  if (in_RDI->position == 7) {
    act(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0);
  }
  else {
    arg1 = get_eq_char(in_RDI,0x13);
    act(unaff_retaddr,in_RDI,arg1,in_stack_ffffffffffffffe8,0);
    act(unaff_retaddr,in_RDI,arg1,in_stack_ffffffffffffffe8,0);
  }
  return;
}

Assistant:

void do_invoke_gabe(CHAR_DATA *ch)
{
	OBJ_DATA *obj;

	if (ch->position == POS_FIGHTING)
	{
		act("You can not invoke your lords power during a fight!", ch, 0, 0, TO_CHAR);
		return;
	}

	obj = get_eq_char(ch, WEAR_BRAND);

	act("$n's $p glows a bright gold.", ch, obj, 0, TO_ROOM);
	act("Your $p glows a bright gold.", ch, obj, 0, TO_CHAR);
}